

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

void sysbvm_typeAndMetatype_setFlags
               (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_bitflags_t flags,
               sysbvm_bitflags_t metatypeFlags)

{
  sysbvm_tuple_t sVar1;
  
  if ((type & 0xf) == 0 && type != 0) {
    *(sysbvm_bitflags_t *)(type + 0x70) = flags << 4 | 0xb;
  }
  sVar1 = sysbvm_tuple_getType(context,type);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    *(sysbvm_bitflags_t *)(sVar1 + 0x70) = metatypeFlags << 4 | 0x1b;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_typeAndMetatype_setFlags(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_bitflags_t flags, sysbvm_bitflags_t metatypeFlags)
{
    sysbvm_type_setFlags(context, type, flags);
    sysbvm_type_setFlags(context, sysbvm_tuple_getType(context, type), SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS | metatypeFlags);
}